

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpfaketransmitter.h
# Opt level: O2

void __thiscall
jrtplib::RTPFakeTransmissionInfo::RTPFakeTransmissionInfo
          (RTPFakeTransmissionInfo *this,list<unsigned_int,_std::allocator<unsigned_int>_> *iplist,
          RTPFakeTransmissionParams *transparams)

{
  list<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  
  (this->super_RTPTransmissionInfo).protocol = UserDefinedProto;
  (this->super_RTPTransmissionInfo)._vptr_RTPTransmissionInfo =
       (_func_int **)&PTR__RTPFakeTransmissionInfo_0014fb60;
  this_00 = &this->localIPlist;
  (this->localIPlist).super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)this_00;
  (this->localIPlist).super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)this_00;
  (this->localIPlist).super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
  _M_size = 0;
  std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::operator=(this_00,iplist);
  this->params = transparams;
  return;
}

Assistant:

RTPFakeTransmissionInfo(std::list<uint32_t> iplist,
            RTPFakeTransmissionParams *transparams) : 
        RTPTransmissionInfo(RTPTransmitter::UserDefinedProto) 
    { localIPlist = iplist; params = transparams; }